

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DelaySyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DelaySyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  DelaySyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->hash).kind;
    token._2_1_ = (this->hash).field_0x2;
    token.numFlags.raw = (this->hash).numFlags.raw;
    token.rawLen = (this->hash).rawLen;
    token.info = (this->hash).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->delayValue)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DelaySyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return hash;
        case 1: return delayValue.get();
        default: return nullptr;
    }
}